

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

void __thiscall Debugger::CacheValue(Debugger *this,int valueIndex,Idx<Variable> variable)

{
  lua_State *plVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Variable *pVVar7;
  uint uVar8;
  ulong uVar9;
  uint __len;
  Idx<Variable> id;
  string key;
  char *local_50 [2];
  char local_40 [16];
  
  plVar1 = this->currentL;
  if (plVar1 != (lua_State *)0x0) {
    uVar4 = (*lua_type)(plVar1,valueIndex);
    iVar2 = cacheId;
    if ((uVar4 & 0xfffffffd) == 5) {
      cacheId = cacheId + 1;
      id._4_4_ = 0;
      id.Raw = variable.Raw;
      id._arena = variable._arena;
      pVVar7 = Arena<Variable>::Index(variable._arena,id);
      pVVar7->cacheId = iVar2;
      iVar5 = (*lua_gettop)(plVar1);
      (*lua_getfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
      iVar6 = (*lua_type)(plVar1,-1);
      if (iVar6 == 0) {
        (*lua_settop)(plVar1,-2);
        (*lua_createtable)(plVar1,0,0);
        (*lua_setfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
        (*lua_getfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
      }
      (*lua_pushvalue)(plVar1,valueIndex);
      uVar4 = -iVar2;
      if (0 < iVar2) {
        uVar4 = iVar2;
      }
      __len = 1;
      if (9 < uVar4) {
        uVar9 = (ulong)uVar4;
        uVar3 = 4;
        do {
          __len = uVar3;
          uVar8 = (uint)uVar9;
          if (uVar8 < 100) {
            __len = __len - 2;
            goto LAB_0014683c;
          }
          if (uVar8 < 1000) {
            __len = __len - 1;
            goto LAB_0014683c;
          }
          if (uVar8 < 10000) goto LAB_0014683c;
          uVar9 = uVar9 / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar8);
        __len = __len + 1;
      }
LAB_0014683c:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(iVar2 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_50[0] + ((uint)iVar2 >> 0x1f),__len,uVar4);
      (*lua_setfield)(plVar1,-2,local_50[0]);
      (*lua_settop)(plVar1,iVar5);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
  }
  return;
}

Assistant:

void Debugger::CacheValue(int valueIndex, Idx<Variable> variable) const {
	if (!currentL) {
		return;
	}

	auto L = currentL;

	const int type = lua_type(L, valueIndex);
	if (type == LUA_TUSERDATA || type == LUA_TTABLE) {
		const int id = cacheId++;
		variable->cacheId = id;
		const int top = lua_gettop(L);
		lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable|nil
		if (lua_isnil(L, -1)) {
			lua_pop(L, 1);                                       //
			lua_newtable(L);                                     // 1: {}
			lua_setfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);//
			lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable
		}

		lua_pushvalue(L, valueIndex);// 1: cacheTable, 2: value

		// snprintf 性能不够，问题也很大，这里采用c++标准算法
		std::string key = std::to_string(id);
		lua_setfield(L, -2, key.c_str());// 1: cacheTable

		lua_settop(L, top);
	}
}